

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permute.cpp
# Opt level: O2

int __thiscall ncnn::Permute::forward(Permute *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t _elemsize;
  void *pvVar1;
  int i_3;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  undefined4 *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  undefined4 *puVar10;
  undefined4 *puVar11;
  int j;
  uint uVar12;
  ulong uVar13;
  int i_2;
  int j_1;
  long lVar14;
  int i;
  uint _h;
  int local_b0;
  long local_a8;
  Mat local_68;
  
  if ((uint)this->order_type < 6) {
    uVar12 = bottom_blob->w;
    lVar14 = (long)(int)uVar12;
    _h = bottom_blob->h;
    uVar9 = bottom_blob->c;
    _elemsize = bottom_blob->elemsize;
    switch(this->order_type) {
    case 0:
      local_b0 = 0;
      Mat::operator=(top_blob,bottom_blob);
      break;
    case 1:
      Mat::create(top_blob,_h,uVar12,uVar9,_elemsize,opt->blob_allocator);
      local_b0 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        local_b0 = 0;
        uVar4 = 0;
        if (0 < (int)_h) {
          uVar4 = (ulong)_h;
        }
        uVar3 = 0;
        if (0 < (int)uVar12) {
          uVar3 = (ulong)uVar12;
        }
        uVar12 = 0;
        if (0 < (int)uVar9) {
          uVar12 = uVar9;
        }
        for (uVar9 = 0; uVar9 != uVar12; uVar9 = uVar9 + 1) {
          Mat::channel(&local_68,bottom_blob,uVar9);
          puVar11 = (undefined4 *)local_68.data;
          Mat::~Mat(&local_68);
          Mat::channel(&local_68,top_blob,uVar9);
          puVar10 = (undefined4 *)local_68.data;
          Mat::~Mat(&local_68);
          for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
            puVar5 = puVar11;
            for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
              puVar10[uVar8] = *puVar5;
              puVar5 = puVar5 + lVar14;
            }
            puVar10 = puVar10 + (int)_h;
            puVar11 = puVar11 + 1;
          }
        }
      }
      break;
    case 2:
      Mat::create(top_blob,uVar12,uVar9,_h,_elemsize,opt->blob_allocator);
      local_b0 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        uVar4 = 0;
        if (0 < (int)uVar12) {
          uVar4 = (ulong)uVar12;
        }
        uVar3 = 0;
        if (0 < (int)uVar9) {
          uVar3 = (ulong)uVar9;
        }
        local_b0 = 0;
        if ((int)_h < 1) {
          _h = 0;
        }
        for (uVar12 = 0; uVar12 != _h; uVar12 = uVar12 + 1) {
          Mat::channel(&local_68,top_blob,uVar12);
          puVar11 = (undefined4 *)local_68.data;
          Mat::~Mat(&local_68);
          for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
            Mat::channel(&local_68,bottom_blob,(int)uVar6);
            pvVar1 = local_68.data;
            iVar2 = local_68.w * uVar12;
            Mat::~Mat(&local_68);
            for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
              puVar11[uVar8] = *(undefined4 *)((long)pvVar1 + ((long)iVar2 + uVar8) * 4);
            }
            puVar11 = puVar11 + lVar14;
          }
        }
      }
      break;
    case 3:
      Mat::create(top_blob,uVar9,uVar12,_h,_elemsize,opt->blob_allocator);
      local_b0 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        uVar4 = 0;
        if (0 < (int)uVar9) {
          uVar4 = (ulong)uVar9;
        }
        uVar3 = 0;
        if (0 < (int)uVar12) {
          uVar3 = (ulong)uVar12;
        }
        local_b0 = 0;
        if ((int)_h < 1) {
          _h = 0;
        }
        for (uVar12 = 0; uVar12 != _h; uVar12 = uVar12 + 1) {
          Mat::channel(&local_68,top_blob,uVar12);
          puVar11 = (undefined4 *)local_68.data;
          Mat::~Mat(&local_68);
          for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
            for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
              Mat::channel(&local_68,bottom_blob,(int)uVar8);
              pvVar1 = local_68.data;
              lVar14 = (long)local_68.w;
              Mat::~Mat(&local_68);
              puVar11[uVar8] = *(undefined4 *)((long)pvVar1 + (lVar14 * (int)uVar12 + uVar6) * 4);
            }
            puVar11 = puVar11 + (int)uVar9;
          }
        }
      }
      break;
    case 4:
      Mat::create(top_blob,_h,uVar9,uVar12,_elemsize,opt->blob_allocator);
      local_b0 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        local_b0 = 0;
        uVar4 = (ulong)_h;
        if ((int)_h < 1) {
          uVar4 = 0;
        }
        uVar3 = 0;
        if (0 < (int)uVar9) {
          uVar3 = (ulong)uVar9;
        }
        uVar6 = 0;
        if (0 < (int)uVar12) {
          uVar6 = (ulong)uVar12;
        }
        local_a8 = 0;
        for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
          Mat::channel(&local_68,top_blob,(int)uVar8);
          puVar11 = (undefined4 *)local_68.data;
          Mat::~Mat(&local_68);
          for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
            Mat::channel(&local_68,bottom_blob,(int)uVar7);
            puVar10 = (undefined4 *)((long)local_68.data + local_a8);
            Mat::~Mat(&local_68);
            for (uVar13 = 0; uVar4 != uVar13; uVar13 = uVar13 + 1) {
              puVar11[uVar13] = *puVar10;
              puVar10 = puVar10 + lVar14;
            }
            puVar11 = puVar11 + (int)uVar9;
          }
          local_a8 = local_a8 + 4;
        }
      }
      break;
    case 5:
      Mat::create(top_blob,uVar9,_h,uVar12,_elemsize,opt->blob_allocator);
      local_b0 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        uVar4 = 0;
        if (0 < (int)uVar9) {
          uVar4 = (ulong)uVar9;
        }
        local_b0 = 0;
        uVar3 = (ulong)_h;
        if ((int)_h < 1) {
          uVar3 = 0;
        }
        uVar6 = 0;
        if (0 < (int)uVar12) {
          uVar6 = (ulong)uVar12;
        }
        for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
          Mat::channel(&local_68,top_blob,(int)uVar8);
          puVar11 = (undefined4 *)local_68.data;
          Mat::~Mat(&local_68);
          for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
            for (uVar13 = 0; uVar4 != uVar13; uVar13 = uVar13 + 1) {
              Mat::channel(&local_68,bottom_blob,(int)uVar13);
              pvVar1 = local_68.data;
              Mat::~Mat(&local_68);
              puVar11[uVar13] = *(undefined4 *)((long)pvVar1 + (uVar7 * lVar14 + uVar8) * 4);
            }
            puVar11 = puVar11 + (int)uVar9;
          }
        }
      }
    }
  }
  else {
    local_b0 = 0;
  }
  return local_b0;
}

Assistant:

int Permute::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    // order_type
    // 0 = w h c
    // 1 = h w c
    // 2 = w c h
    // 3 = c w h
    // 4 = h c w
    // 5 = c h w

    if (order_type == 0)
    {
        top_blob = bottom_blob;
    }
    else if (order_type == 1)
    {
        top_blob.create(h, w, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < w; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    outptr[i*h + j] = ptr[j*w + i];
                }
            }
        }
    }
    else if (order_type == 2)
    {
        top_blob.create(w, channels, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<h; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < channels; i++)
            {
                const float* ptr = bottom_blob.channel(i).row(q);

                for (int j = 0; j < w; j++)
                {
                    outptr[i*w + j] = ptr[j];
                }
            }
        }
    }
    else if (order_type == 3)
    {
        top_blob.create(channels, w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<h; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < w; i++)
            {
                for (int j = 0; j < channels; j++)
                {
                    const float* ptr = bottom_blob.channel(j).row(q);

                    outptr[i*channels + j] = ptr[i];
                }
            }
        }
    }
    else if (order_type == 4)
    {
        top_blob.create(h, channels, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<w; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < channels; i++)
            {
                const float* ptr = bottom_blob.channel(i);

                for (int j = 0; j < h; j++)
                {
                    outptr[i*channels + j] = ptr[j*w + q];
                }
            }
        }
    }
    else if (order_type == 5)
    {
        top_blob.create(channels, h, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<w; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < channels; j++)
                {
                    const float* ptr = bottom_blob.channel(j);

                    outptr[i*channels + j] = ptr[i*w + q];
                }
            }
        }
    }

    return 0;
}